

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperCardPro.cpp
# Opt level: O0

bool __thiscall
SuperCardPro::SendCmd(SuperCardPro *this,uint8_t cmd,void *buf,int len,void *bulkbuf,int bulklen)

{
  value_type vVar1;
  bool bVar2;
  int len_00;
  reference pvVar3;
  exception *this_00;
  uint8_t local_82;
  uint8_t local_81;
  undefined4 local_80;
  uint8_t result [2];
  allocator<unsigned_char> local_69;
  undefined1 local_68 [8];
  Data data;
  int i;
  uint8_t datasum;
  uint8_t *p;
  int bulklen_local;
  void *bulkbuf_local;
  int len_local;
  void *buf_local;
  uint8_t cmd_local;
  SuperCardPro *this_local;
  
  data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._7_1_ = 'J';
  for (data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage < len;
      data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 1) {
    data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ =
         data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage._7_1_ +
         *(char *)((long)buf +
                  (long)(int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::allocator<unsigned_char>::allocator(&local_69);
  Data::vector((Data *)local_68,(long)(len + 3),&local_69);
  std::allocator<unsigned_char>::~allocator(&local_69);
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  *pvVar3 = cmd;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,1);
  *pvVar3 = (value_type)len;
  if (len != 0) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,2);
    memcpy(pvVar3,buf,(long)len);
  }
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  vVar1 = *pvVar3;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,1);
  vVar1 = vVar1 + *pvVar3 +
          data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,
                      (long)(len + 2));
  *pvVar3 = vVar1;
  pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_68,0);
  len_00 = Data::size((Data *)local_68);
  bVar2 = WriteExact(this,pvVar3,len_00);
  if (bVar2) {
    if (cmd == 0xaa) {
      bVar2 = WriteExact(this,bulkbuf,bulklen);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_00235101;
      }
    }
    if (cmd == 0xa9) {
      bVar2 = ReadExact(this,bulkbuf,bulklen);
      if (!bVar2) {
        this_local._7_1_ = false;
        goto LAB_00235101;
      }
    }
    bVar2 = ReadExact(this,&local_82,2);
    if (bVar2) {
      if (local_82 != cmd) {
        this_00 = (exception *)__cxa_allocate_exception(0x10);
        util::exception::exception<char_const(&)[28]>
                  (this_00,(char (*) [28])"SCP result command mismatch");
        __cxa_throw(this_00,&util::exception::typeinfo,util::exception::~exception);
      }
      if (local_81 == 'O') {
        this->m_error = 'O';
        this_local._7_1_ = true;
      }
      else {
        this->m_error = local_81;
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
LAB_00235101:
  local_80 = 1;
  Data::~Data((Data *)local_68);
  return this_local._7_1_;
}

Assistant:

bool SuperCardPro::SendCmd(uint8_t cmd, void* buf, int len, void* bulkbuf, int bulklen)
{
    auto p = reinterpret_cast<uint8_t*>(buf);
    uint8_t datasum = CHECKSUM_INIT;
    for (auto i = 0; i < len; ++i)
        datasum += p[i];

    Data data(2 + len + 1);
    data[0] = cmd;
    data[1] = static_cast<uint8_t>(len);
    if (len) memcpy(&data[2], buf, len);
    data[2 + len] = data[0] + data[1] + datasum;

    if (!WriteExact(&data[0], data.size()))
        return false;

    if (cmd == CMD_LOADRAM_USB && !WriteExact(bulkbuf, bulklen))
        return false;
    else if (cmd == CMD_SENDRAM_USB && !ReadExact(bulkbuf, bulklen))
        return false;

    uint8_t result[2];
    if (!ReadExact(result, sizeof(result)))
        return false;

    if (result[0] != cmd)
        throw util::exception("SCP result command mismatch");

    if (result[1] != pr_Ok)
    {
        m_error = result[1];
        return false;
    }

    m_error = result[1];    // pr_Ok
    return true;
}